

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_tail_multiple.h
# Opt level: O0

Allocation * __thiscall
density::detail::
SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)3>
          (Allocation *__return_storage_ptr__,
          SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>
          *this,uintptr_t i_control_bits,bool i_include_type,size_t i_size,size_t i_alignment)

{
  bool bVar1;
  void *pvVar2;
  void *pvVar3;
  ControlBlock *i_atomic;
  uintptr_t uVar4;
  uintptr_t uVar5;
  ControlBlock *pCVar6;
  size_t i_offset;
  uintptr_t next_ptr;
  ControlBlock *control_block;
  uintptr_t new_tail_offset;
  ControlBlock *new_tail;
  void *user_storage;
  void *address;
  ControlBlock *tail;
  undefined1 local_48 [8];
  unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_> lock;
  size_t sStack_30;
  LfQueue_ProgressGuarantee guarantee;
  size_t i_alignment_local;
  size_t i_size_local;
  bool i_include_type_local;
  uintptr_t i_control_bits_local;
  SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>
  *this_local;
  
  lock._12_4_ = 3;
  if ((i_control_bits & 0xfffffffffffffff8) != 0) {
    density_tests::detail::assert_failed<>
              ("(i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
               ,0xba);
  }
  bVar1 = is_power_of_2(i_alignment);
  if ((!bVar1) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
               ,0xbb);
  }
  sStack_30 = i_alignment;
  i_alignment_local = i_size;
  if (i_alignment < 8) {
    sStack_30 = 8;
    i_alignment_local = uint_upper_align<unsigned_long>(i_size,8);
  }
  std::unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_>::unique_lock
            ((unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_> *)local_48,
             &this->m_mutex);
  if ((lock._12_4_ == 0) || (lock._12_4_ == 1)) {
    std::unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_>::lock
              ((unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_> *)local_48)
    ;
  }
  else {
    bVar1 = std::unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_>::try_lock
                      ((unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_> *)
                       local_48);
    if (!bVar1) {
      LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>_>
      ::Allocation::Allocation((Allocation *)__return_storage_ptr__);
      goto LAB_028ad589;
    }
  }
  address = this->m_tail;
  while( true ) {
    if ((address == (void *)0x0) || (bVar1 = address_is_aligned(address,0x40), !bVar1)) {
      density_tests::detail::assert_failed<>
                ("tail != nullptr && address_is_aligned(tail, s_alloc_granularity)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
                 ,0xd2);
    }
    i_offset = 8;
    if (i_include_type) {
      i_offset = 0x10;
    }
    pvVar2 = address_add(address,i_offset);
    pvVar2 = address_upper_align(pvVar2,sStack_30);
    pvVar3 = address_add(pvVar2,i_alignment_local);
    i_atomic = (ControlBlock *)address_upper_align(pvVar3,0x40);
    pvVar3 = address_lower_align(address,0x100);
    uVar4 = address_diff(i_atomic,pvVar3);
    if (uVar4 < 0xc1) {
      raw_atomic_store((uintptr_t *)i_atomic,0,memory_order_seq_cst);
      uVar4 = (long)&i_atomic->m_next + i_control_bits;
      uVar5 = raw_atomic_load((uintptr_t *)address,memory_order_seq_cst);
      if (uVar5 != 0) {
        density_tests::detail::assert_failed<>
                  ("raw_atomic_load(&control_block->m_next, mem_relaxed) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
                   ,0xf1);
      }
      raw_atomic_store((uintptr_t *)address,uVar4,memory_order_seq_cst);
      pCVar6 = LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>_>
               ::get_end_control_block(address);
      if (pCVar6 <= address) {
        density_tests::detail::assert_failed<>
                  ("control_block < get_end_control_block(tail)",
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
                   ,0xf4);
      }
      this->m_tail = i_atomic;
      LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>_>
      ::Allocation::Allocation
                ((Allocation *)__return_storage_ptr__,(LfQueueControl *)address,uVar4,pvVar2);
      goto LAB_028ad589;
    }
    if (0xb0 < i_alignment_local + (sStack_30 - 8)) {
      if ((lock._12_4_ == 2) || (lock._12_4_ == 3)) {
        LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>_>
        ::Allocation::Allocation((Allocation *)__return_storage_ptr__);
      }
      else {
        std::unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_>::unlock
                  ((unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_> *)
                   local_48);
        LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>_>
        ::external_allocate<(density::detail::LfQueue_ProgressGuarantee)3>
                  (__return_storage_ptr__,
                   &this->
                    super_LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>_>
                   ,i_control_bits,i_alignment_local,sStack_30);
      }
      goto LAB_028ad589;
    }
    address = page_overflow(this,LfQueue_WaitFree,(ControlBlock *)address);
    if ((lock._12_4_ != 0) && ((ControlBlock *)address == (ControlBlock *)0x0)) break;
    this->m_tail = (ControlBlock *)address;
  }
  LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>_>
  ::Allocation::Allocation((Allocation *)__return_storage_ptr__);
LAB_028ad589:
  std::unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_>::~unique_lock
            ((unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate_impl(
              uintptr_t i_control_bits,
              bool      i_include_type,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                DENSITY_ASSERT_INTERNAL(
                  (i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0);
                DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

                if (i_alignment < min_alignment)
                {
                    i_alignment = min_alignment;
                    i_size      = uint_upper_align(i_size, min_alignment);
                }

                std::unique_lock<decltype(m_mutex)> lock(m_mutex, std::defer_lock);
                if (guarantee == LfQueue_Throwing || guarantee == LfQueue_Blocking)
                {
                    lock.lock();
                }
                else
                {
                    if (!lock.try_lock())
                        return Allocation{};
                }

                auto tail = m_tail;
                for (;;)
                {
                    DENSITY_ASSERT_INTERNAL(
                      tail != nullptr && address_is_aligned(tail, s_alloc_granularity));

                    // allocate space for the control block (and possibly the runtime type)
                    void * address = address_add(
                      tail, i_include_type ? s_element_min_offset : s_rawblock_min_offset);

                    // allocate space for the element
                    address                   = address_upper_align(address, i_alignment);
                    void * const user_storage = address;
                    address                   = address_add(address, i_size);
                    address                   = address_upper_align(address, s_alloc_granularity);
                    auto const new_tail       = static_cast<ControlBlock *>(address);

                    // check for page overflow
                    auto const new_tail_offset = address_diff(
                      new_tail, address_lower_align(tail, ALLOCATOR_TYPE::page_alignment));
                    if (DENSITY_LIKELY(new_tail_offset <= s_end_control_offset))
                    {
                        /* note: while control_block->m_next is zero, no consumers may ever read this
                        variable. So this does not need to be atomic store. */
                        //new_tail->m_next = 0;
                        /* edit: clang5 thread sanitizer has reported a data race between this write and the read:
                        auto const next_uint = raw_atomic_load(&control->m_next, mem_relaxed);
                        in start_consume_impl (detail\lf_queue_head_multiple.h).
                        Making the store atomic.... */
                        raw_atomic_store(&new_tail->m_next, uintptr_t(0));

                        auto const control_block = tail;
                        auto const next_ptr =
                          reinterpret_cast<uintptr_t>(new_tail) + i_control_bits;
                        DENSITY_ASSERT_INTERNAL(
                          raw_atomic_load(&control_block->m_next, mem_relaxed) == 0);
                        raw_atomic_store(&control_block->m_next, next_ptr, mem_release);

                        DENSITY_ASSERT_INTERNAL(control_block < get_end_control_block(tail));
                        m_tail = new_tail;
                        return {control_block, next_ptr, user_storage};
                    }
                    else if (
                      i_size + (i_alignment - min_alignment) <=
                      s_max_size_inpage) // if this allocation may fit in a page
                    {
                        tail = page_overflow(PROGRESS_GUARANTEE, tail);
                        if (guarantee != LfQueue_Throwing)
                        {
                            if (tail == 0)
                            {
                                return Allocation{};
                            }
                        }
                        else
                        {
                            DENSITY_ASSUME(tail != 0);
                        }
                        m_tail = tail;
                    }
                    else // this allocation would never fit in a page, allocate an external block
                    {
                        // legacy heap allocations can only be blocking
                        if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                            return Allocation{};

                        lock.unlock(); // this avoids recursive locks
                        return Base::template external_allocate<PROGRESS_GUARANTEE>(
                          i_control_bits, i_size, i_alignment);
                    }
                }
            }